

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irExpression * build_ir_assign(Context_conflict *ctx,MOJOSHADER_astExpressionBinary *ast)

{
  MOJOSHADER_astDataTypeType type_00;
  int elements;
  int index;
  MOJOSHADER_irExpression *pMVar1;
  MOJOSHADER_irExpression *pMVar2;
  MOJOSHADER_irExpression *dst;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_irStatement *next;
  int tmp;
  int elems;
  MOJOSHADER_astDataTypeType type;
  MOJOSHADER_irExpression *rvalue;
  MOJOSHADER_irExpression *lvalue;
  MOJOSHADER_astExpressionBinary *ast_local;
  Context_conflict *ctx_local;
  
  pMVar1 = build_ir_expr(ctx,ast->left);
  pMVar2 = build_ir_expr(ctx,ast->right);
  type_00 = (pMVar1->info).type;
  elements = (pMVar1->info).elements;
  index = generate_ir_temp(ctx);
  if (type_00 != (pMVar2->info).type) {
    __assert_fail("type == rvalue->info.type",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x1523,
                  "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
                 );
  }
  if (elements == (pMVar2->info).elements) {
    dst = new_ir_temp(ctx,index,type_00,elements);
    pMVar3 = new_ir_move(ctx,dst,pMVar2,-1);
    pMVar2 = new_ir_temp(ctx,index,type_00,elements);
    next = new_ir_move(ctx,pMVar1,pMVar2,-1);
    pMVar3 = new_ir_seq(ctx,pMVar3,next);
    pMVar1 = new_ir_temp(ctx,index,type_00,elements);
    pMVar1 = new_ir_eseq(ctx,pMVar3,pMVar1);
    return pMVar1;
  }
  __assert_fail("elems == rvalue->info.elements",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x1524,
                "MOJOSHADER_irExpression *build_ir_assign(Context *, const MOJOSHADER_astExpressionBinary *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_assign(Context *ctx,
                                                const MOJOSHADER_astExpressionBinary *ast)
{
    MOJOSHADER_irExpression *lvalue = build_ir_expr(ctx, ast->left);
    MOJOSHADER_irExpression *rvalue = build_ir_expr(ctx, ast->right);
    const MOJOSHADER_astDataTypeType type = lvalue->info.type;
    const int elems = lvalue->info.elements;
    const int tmp = generate_ir_temp(ctx);

    // Semantic analysis should have inserted casts if necessary.
    assert(type == rvalue->info.type);
    assert(elems == rvalue->info.elements);

    // !!! FIXME: write masking!
    // !!! FIXME: whole array/struct assignments need to become a sequence of moves.
    return new_ir_eseq(ctx,
                new_ir_seq(ctx,
                    new_ir_move(ctx, new_ir_temp(ctx, tmp, type, elems), rvalue, -1),
                    new_ir_move(ctx, lvalue, new_ir_temp(ctx, tmp, type, elems), -1)),
                new_ir_temp(ctx, tmp, type, elems));
}